

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

int newstate(lua_State *L)

{
  void *in_RAX;
  lua_Alloc f;
  lua_State *L_00;
  void *ud;
  
  ud = in_RAX;
  f = lua_getallocf(L,&ud);
  L_00 = lua_newstate(f,ud);
  if (L_00 == (lua_State *)0x0) {
    lua_pushnil(L);
  }
  else {
    lua_atpanic(L_00,tpanic);
    lua_pushlightuserdata(L,L_00);
  }
  return 1;
}

Assistant:

static int newstate (lua_State *L) {
  void *ud;
  lua_Alloc f = lua_getallocf(L, &ud);
  lua_State *L1 = lua_newstate(f, ud);
  if (L1) {
    lua_atpanic(L1, tpanic);
    lua_pushlightuserdata(L, L1);
  }
  else
    lua_pushnil(L);
  return 1;
}